

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_verify_face_manifold(REF_CAVITY ref_cavity)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT found_face;
  REF_INT face;
  REF_CAVITY ref_cavity_local;
  
  if (ref_cavity->state != REF_CAVITY_INCONSISTENT) {
    _found_face = ref_cavity;
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < _found_face->maxface;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < _found_face->maxface))
         && (_found_face->f2n[ref_private_macro_code_rss * 3] != -1)) {
        uVar1 = ref_cavity_find_face_with_side
                          (_found_face,_found_face->f2n[ref_private_macro_code_rss * 3 + 1],
                           _found_face->f2n[ref_private_macro_code_rss * 3],
                           &ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x1d9,"ref_cavity_verify_face_manifold",(ulong)uVar1,"find side 01");
          return uVar1;
        }
        if (_found_face->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (ref_private_macro_code_rss_1 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x1dc,"ref_cavity_verify_face_manifold","side 01 missing");
          return 1;
        }
        uVar1 = ref_cavity_find_face_with_side
                          (_found_face,_found_face->f2n[ref_private_macro_code_rss * 3 + 2],
                           _found_face->f2n[ref_private_macro_code_rss * 3 + 1],
                           &ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x1e0,"ref_cavity_verify_face_manifold",(ulong)uVar1,"find side 12");
          return uVar1;
        }
        if (_found_face->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (ref_private_macro_code_rss_1 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x1e3,"ref_cavity_verify_face_manifold","side 12 missing");
          return 1;
        }
        uVar1 = ref_cavity_find_face_with_side
                          (_found_face,_found_face->f2n[ref_private_macro_code_rss * 3],
                           _found_face->f2n[ref_private_macro_code_rss * 3 + 2],
                           &ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x1e7,"ref_cavity_verify_face_manifold",(ulong)uVar1,"find side 20");
          return uVar1;
        }
        if (_found_face->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (ref_private_macro_code_rss_1 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x1ea,"ref_cavity_verify_face_manifold","side 20 missing");
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_verify_face_manifold(
    REF_CAVITY ref_cavity) {
  REF_INT face, found_face;

  if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
    return REF_SUCCESS;

  each_ref_cavity_valid_face(ref_cavity, face) {
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 1, face),
            ref_cavity_f2n(ref_cavity, 0, face), &found_face),
        "find side 01");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 01 missing");
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 2, face),
            ref_cavity_f2n(ref_cavity, 1, face), &found_face),
        "find side 12");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 12 missing");
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 0, face),
            ref_cavity_f2n(ref_cavity, 2, face), &found_face),
        "find side 20");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 20 missing");
  }

  return REF_SUCCESS;
}